

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action_Request_R_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Action_Request_R_PDU::GetAsString_abi_cxx11_(Action_Request_R_PDU *this)

{
  long in_RSI;
  
  GetAsString_abi_cxx11_((KString *)this,(Action_Request_R_PDU *)(in_RSI + -0x90));
  return;
}

Assistant:

KString Action_Request_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Action Request-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << Reliability_Header::GetAsString()
       << "\tRequest ID:               "   << m_ui32RequestID
       << "\n\tAction ID:                " << GetEnumAsStringActionID( m_ui32ActionID )
       << "\n\tNumber Fixed Datum:       " << m_ui32NumFixedDatum
       << "\n\tNumber Variable Datum:    " << m_ui32NumVariableDatum
       << "\n";

    ss << "Fixed Datum\n";
    vector<FixDtmPtr>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<FixDtmPtr>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ss << IndentString( ( *citrFixed )->GetAsString() );
    }

    ss << "Variable Datum\n";
    vector<VarDtmPtr>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<VarDtmPtr>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ss << IndentString( ( *citrVar )->GetAsString() );
    }

    return ss.str();
}